

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symmetric_difference_iterator.hpp
# Opt level: O2

void __thiscall
burst::
symmetric_difference_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_*,_std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>,_std::less<void>_>
::maintain_invariant
          (symmetric_difference_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_*,_std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>,_std::less<void>_>
           *this)

{
  iterator_range<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  *piVar1;
  __normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_*,_std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
  _Var2;
  undefined8 unaff_RBX;
  
  _Var2._M_current = (this->m_begin)._M_current;
  while( true ) {
    _Var2 = select_min<__gnu_cxx::__normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>*,std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>,std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>>>,burst::compose_fn<burst::apply_fn<std::less<void>>,burst::compose_fn<burst::by_all_fn<burst::front_t>,burst::forward_as_tuple_fn>>>
                      (_Var2,(this->m_end)._M_current,SUB83(unaff_RBX,0));
    (this->m_min_end)._M_current = _Var2._M_current;
    piVar1 = (this->m_begin)._M_current;
    if ((_Var2._M_current == piVar1) || (((int)_Var2._M_current - (int)piVar1 & 0x10U) != 0)) break;
    std::
    for_each<__gnu_cxx::__normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>*,std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>,std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>>>,burst::symmetric_difference_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>*,std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>,std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>>>,std::less<void>>::maintain_invariant()::_lambda(auto:1&)_1_>
              (piVar1,_Var2._M_current);
    remove_empty_ranges(this);
    _Var2._M_current = (this->m_begin)._M_current;
  }
  return;
}

Assistant:

void maintain_invariant ()
        {
            m_min_end = select_min(m_begin, m_end, each(front) | m_compare);
            while (m_min_end != m_begin && std::distance(m_begin, m_min_end) % 2 == 0)
            {
                std::for_each(m_begin, m_min_end, [] (auto & r) {r.advance_begin(1);});
                remove_empty_ranges();
                m_min_end = select_min(m_begin, m_end, each(front) | m_compare);
            }
        }